

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cupdlp_cs.c
# Opt level: O0

int cupdlp_dcs_sprealloc(cupdlp_dcs *A,int nzmax)

{
  void *pvVar1;
  int in_ESI;
  int *in_RDI;
  void *unaff_retaddr;
  int okx;
  int okj;
  int oki;
  int ok;
  int local_2c;
  int local_1c;
  undefined4 in_stack_ffffffffffffffe8;
  int in_stack_fffffffffffffffc;
  uint uVar2;
  
  if (in_RDI == (int *)0x0) {
    uVar2 = 0;
  }
  else {
    local_2c = in_ESI;
    if (in_ESI < 1) {
      if ((in_RDI == (int *)0x0) || (in_RDI[10] != -1)) {
        local_2c = in_RDI[10];
      }
      else {
        local_2c = *(int *)(*(long *)(in_RDI + 4) + (long)in_RDI[2] * 4);
      }
    }
    if (local_2c < 2) {
      local_2c = 1;
    }
    pvVar1 = cupdlp_dcs_realloc(unaff_retaddr,in_stack_fffffffffffffffc,(size_t)in_RDI,
                                (int *)CONCAT44(local_2c,in_stack_ffffffffffffffe8));
    *(void **)(in_RDI + 6) = pvVar1;
    if ((in_RDI != (int *)0x0) && (-1 < in_RDI[10])) {
      pvVar1 = cupdlp_dcs_realloc(unaff_retaddr,in_stack_fffffffffffffffc,(size_t)in_RDI,
                                  (int *)CONCAT44(local_2c,in_stack_ffffffffffffffe8));
      *(void **)(in_RDI + 4) = pvVar1;
    }
    if (*(long *)(in_RDI + 8) != 0) {
      pvVar1 = cupdlp_dcs_realloc(unaff_retaddr,in_stack_fffffffffffffffc,(size_t)in_RDI,
                                  (int *)CONCAT44(local_2c,in_stack_ffffffffffffffe8));
      *(void **)(in_RDI + 8) = pvVar1;
    }
    uVar2 = (uint)(local_1c != 0);
    if (uVar2 != 0) {
      *in_RDI = local_2c;
    }
  }
  return uVar2;
}

Assistant:

int cupdlp_dcs_sprealloc(cupdlp_dcs *A, int nzmax) {
  int ok, oki, okj = 1, okx = 1;
  if (!A) return (0);
  if (nzmax <= 0) nzmax = IS_CSC(A) ? (A->p[A->n]) : A->nz;
  nzmax = MAX(nzmax, 1);
  A->i = cupdlp_dcs_realloc(A->i, nzmax, sizeof(int), &oki);
  if (IS_TRIPLET(A)) A->p = cupdlp_dcs_realloc(A->p, nzmax, sizeof(int), &okj);
  if (A->x) A->x = cupdlp_dcs_realloc(A->x, nzmax, sizeof(double), &okx);
  ok = (oki && okj && okx);
  if (ok) A->nzmax = nzmax;
  return (ok);
}